

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O2

bool __thiscall
DIS::FundamentalOperationalData::operator==
          (FundamentalOperationalData *this,FundamentalOperationalData *rhs)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined2 uVar20;
  undefined2 uVar21;
  uint uVar22;
  undefined2 uVar23;
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  unkbyte10 Var26;
  undefined4 in_ECX;
  undefined4 uVar27;
  undefined4 in_EDX;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [11];
  undefined1 auVar34 [16];
  undefined1 auVar40 [16];
  ushort uVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar41 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar42 [16];
  undefined1 auVar32 [12];
  undefined1 auVar37 [16];
  undefined1 auVar33 [13];
  undefined1 auVar38 [16];
  undefined1 auVar43 [16];
  undefined1 auVar39 [16];
  char cVar44;
  char cVar45;
  char cVar46;
  undefined2 uVar47;
  byte bVar48;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  
  uVar1 = this->_systemStatus;
  uVar5 = this->_dataField1;
  uVar7 = this->_informationLayers;
  uVar11 = this->_dataField2;
  uVar13 = this->_parameter1;
  uVar17 = this->_parameter2;
  uVar2 = rhs->_systemStatus;
  uVar6 = rhs->_dataField1;
  uVar8 = rhs->_informationLayers;
  uVar12 = rhs->_dataField2;
  uVar14 = rhs->_parameter1;
  uVar18 = rhs->_parameter2;
  cVar44 = -((char)uVar14 == (char)uVar13);
  cVar45 = -((char)((ushort)uVar14 >> 8) == (char)((ushort)uVar13 >> 8));
  cVar46 = -((char)uVar18 == (char)uVar17);
  bVar48 = -((char)((ushort)uVar18 >> 8) == (char)((ushort)uVar17 >> 8));
  auVar35._0_9_ = CONCAT18(0xff,(ulong)bVar48 << 0x38);
  auVar31._0_10_ = CONCAT19(0xff,auVar35._0_9_);
  auVar31[10] = 0xff;
  auVar32[0xb] = 0xff;
  auVar32._0_11_ = auVar31;
  auVar33[0xc] = 0xff;
  auVar33._0_12_ = auVar32;
  auVar29[0xd] = 0xff;
  auVar29._0_13_ = auVar33;
  auVar29[0xe] = bVar48;
  auVar29[0xf] = bVar48;
  auVar39._14_2_ = auVar29._14_2_;
  auVar39[0xd] = cVar46;
  auVar39._0_13_ = auVar33;
  auVar38._13_3_ = auVar39._13_3_;
  auVar38[0xc] = cVar46;
  auVar38._0_12_ = auVar32;
  auVar37._12_4_ = auVar38._12_4_;
  auVar37[0xb] = cVar45;
  auVar37._0_11_ = auVar31;
  auVar36._11_5_ = auVar37._11_5_;
  auVar36[10] = cVar45;
  auVar36._0_10_ = auVar31._0_10_;
  auVar35._10_6_ = auVar36._10_6_;
  auVar35[9] = cVar44;
  Var26 = CONCAT91(CONCAT81((long)(CONCAT72(auVar35._9_7_,CONCAT11(cVar44,bVar48)) >> 8),
                            -(uVar12 == uVar11)),-(uVar12 == uVar11));
  auVar25._2_10_ = Var26;
  auVar25[1] = -(uVar8 == uVar7);
  auVar25[0] = -(uVar8 == uVar7);
  auVar24._2_12_ = auVar25;
  auVar24[1] = -(uVar6 == uVar5);
  auVar24[0] = -(uVar6 == uVar5);
  auVar34._0_2_ = CONCAT11(-(uVar2 == uVar1),-(uVar2 == uVar1));
  auVar34._2_14_ = auVar24;
  uVar47 = (undefined2)Var26;
  auVar43._0_12_ = auVar34._0_12_;
  auVar43._12_2_ = uVar47;
  auVar43._14_2_ = uVar47;
  auVar42._12_4_ = auVar43._12_4_;
  auVar42._0_10_ = auVar34._0_10_;
  auVar42._10_2_ = auVar25._0_2_;
  auVar41._10_6_ = auVar42._10_6_;
  auVar41._0_8_ = auVar34._0_8_;
  auVar41._8_2_ = auVar25._0_2_;
  auVar40._8_8_ = auVar41._8_8_;
  auVar40._6_2_ = auVar24._0_2_;
  auVar40._4_2_ = auVar24._0_2_;
  auVar40._2_2_ = auVar34._0_2_;
  auVar40._0_2_ = auVar34._0_2_;
  uVar22._0_2_ = this->_parameter1;
  uVar22._2_2_ = this->_parameter2;
  uVar21 = rhs->_parameter1;
  uVar23 = rhs->_parameter2;
  auVar49._0_2_ = -(ushort)(uVar21 == (undefined2)uVar22);
  auVar49._2_2_ = -(ushort)(uVar23 == uVar22._2_2_);
  auVar49._4_2_ = 0xffff;
  auVar49._6_2_ = 0xffff;
  auVar49._8_2_ = 0xffff;
  auVar49._10_2_ = 0xffff;
  auVar49._12_2_ = 0xffff;
  auVar49._14_2_ = 0xffff;
  auVar29 = pshuflw(ZEXT416(uVar22),auVar49,0x50);
  auVar30._0_4_ = auVar29._0_4_;
  auVar30._4_4_ = auVar30._0_4_;
  auVar30._8_4_ = auVar29._4_4_;
  auVar30._12_4_ = auVar29._4_4_;
  uVar27 = movmskpd(in_ECX,auVar30);
  uVar3 = this->_parameter3;
  uVar9 = this->_parameter4;
  uVar15 = this->_parameter5;
  uVar19 = this->_parameter6;
  uVar4 = rhs->_parameter3;
  uVar10 = rhs->_parameter4;
  uVar16 = rhs->_parameter5;
  uVar20 = rhs->_parameter6;
  auVar50._0_2_ = -(ushort)(uVar4 == uVar3);
  uVar53 = -(ushort)(uVar20 == uVar19);
  auVar51._0_10_ = CONCAT28(0xffff,(ulong)uVar53 << 0x30);
  auVar52._10_2_ = 0xffff;
  auVar52._0_10_ = auVar51._0_10_;
  auVar52._12_2_ = uVar53;
  auVar52._14_2_ = uVar53;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._10_2_ = -(ushort)(uVar16 == uVar15);
  auVar50._8_8_ =
       (undefined8)(CONCAT64(auVar51._10_6_,CONCAT22(-(ushort)(uVar16 == uVar15),uVar53)) >> 0x10);
  auVar50._6_2_ = -(ushort)(uVar10 == uVar9);
  auVar50._4_2_ = -(ushort)(uVar10 == uVar9);
  auVar50._2_2_ = auVar50._0_2_;
  iVar28 = movmskps(in_EDX,auVar50 & auVar40);
  return (bool)((byte)uVar27 >> 1 & (byte)uVar27 & iVar28 == 0xf);
}

Assistant:

bool FundamentalOperationalData::operator ==(const FundamentalOperationalData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_systemStatus == rhs._systemStatus) ) ivarsEqual = false;
     if( ! (_dataField1 == rhs._dataField1) ) ivarsEqual = false;
     if( ! (_informationLayers == rhs._informationLayers) ) ivarsEqual = false;
     if( ! (_dataField2 == rhs._dataField2) ) ivarsEqual = false;
     if( ! (_parameter1 == rhs._parameter1) ) ivarsEqual = false;
     if( ! (_parameter2 == rhs._parameter2) ) ivarsEqual = false;
     if( ! (_parameter3 == rhs._parameter3) ) ivarsEqual = false;
     if( ! (_parameter4 == rhs._parameter4) ) ivarsEqual = false;
     if( ! (_parameter5 == rhs._parameter5) ) ivarsEqual = false;
     if( ! (_parameter6 == rhs._parameter6) ) ivarsEqual = false;

    return ivarsEqual;
 }